

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Finalize(VersionSet *this,Version *v)

{
  long lVar1;
  size_type sVar2;
  int64_t iVar3;
  long in_RSI;
  Options *in_RDI;
  long in_FS_OFFSET;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint64_t level_bytes;
  double score;
  int level;
  double best_score;
  int best_level;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffa8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffc8;
  undefined4 local_2c;
  undefined8 local_28;
  undefined4 local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = -1;
  local_28 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             0xbff0000000000000;
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    if (local_2c == 0) {
      sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        (in_stack_ffffffffffffffa8);
      auVar6._8_4_ = (int)(sVar2 >> 0x20);
      auVar6._0_8_ = sVar2;
      auVar6._12_4_ = 0x45300000;
      in_stack_ffffffffffffffc8 =
           (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
           (((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) / 4.0);
    }
    else {
      iVar3 = TotalFileSize(in_stack_ffffffffffffffc8);
      auVar7._8_4_ = (int)((ulong)iVar3 >> 0x20);
      auVar7._0_8_ = iVar3;
      auVar7._12_4_ = 0x45300000;
      dVar4 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)iVar3) - 4503599627370496.0);
      dVar5 = MaxBytesForLevel(in_RDI,(int)((ulong)dVar4 >> 0x20));
      in_stack_ffffffffffffffc8 =
           (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
           (dVar4 / dVar5);
    }
    if ((double)local_28 < (double)in_stack_ffffffffffffffc8) {
      local_1c = local_2c;
      local_28 = in_stack_ffffffffffffffc8;
    }
  }
  *(int *)(in_RSI + 0xe0) = local_1c;
  *(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> **)(in_RSI + 0xd8) =
       local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}